

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void ipred_hor_uv(pel *src,pel *dst,int i_dst,int w,int h)

{
  undefined2 uVar1;
  int uv_pixel;
  int shift;
  int i;
  int h_local;
  int w_local;
  int i_dst_local;
  pel *dst_local;
  pel *src_local;
  s16 *pdst;
  int i_1;
  
  _w_local = dst;
  dst_local = src;
  for (uv_pixel = 0; uv_pixel < h; uv_pixel = uv_pixel + 1) {
    uVar1 = *(undefined2 *)dst_local;
    for (pdst._4_4_ = 0; pdst._4_4_ < w; pdst._4_4_ = pdst._4_4_ + 1) {
      *(undefined2 *)(_w_local + (long)pdst._4_4_ * 2) = uVar1;
    }
    _w_local = _w_local + i_dst;
    dst_local = dst_local + -2;
  }
  return;
}

Assistant:

void ipred_hor_uv(pel *src, pel *dst, int i_dst, int w, int h)
{
    int i;
    int shift = sizeof(pel) * 8;
    
    for (i = 0; i < h; i++) {
        int uv_pixel = (src[1] << shift) + src[0];
        com_mset_2pel(dst, uv_pixel, w);
        dst += i_dst;
        src -= 2;
    }
}